

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

void __thiscall DBOPL::Operator::Write80(Operator *this,Chip *chip,Bit8u val)

{
  byte bVar1;
  
  bVar1 = this->reg80;
  if (bVar1 != val) {
    this->reg80 = val;
    this->sustainLevel = (uint)(byte)((val >> 4) + 1 & 0x10 | val >> 4) << 4;
    if (((bVar1 ^ val) & 0xf) != 0) {
      if ((val & 0xf) == 0) {
        bVar1 = this->rateZero;
        this->rateZero = bVar1 | 2;
        this->releaseAdd = 0;
        if ((this->reg20 & 0x20) != 0) {
          return;
        }
        bVar1 = bVar1 | 6;
      }
      else {
        this->releaseAdd = chip->linearRates[(byte)((val & 0xf) * '\x04' + this->ksr)];
        bVar1 = this->rateZero;
        this->rateZero = bVar1 & 0xfd;
        if ((this->reg20 & 0x20) != 0) {
          return;
        }
        bVar1 = bVar1 & 0xf9;
      }
      this->rateZero = bVar1;
    }
  }
  return;
}

Assistant:

void Operator::Write80( const Chip* chip, Bit8u val ) {
	Bit8u change = (reg80 ^ val );
	if ( !change )
		return;
	reg80 = val;
	Bit8u sustain = val >> 4;
	//Turn 0xf into 0x1f
	sustain |= ( sustain + 1) & 0x10;
	sustainLevel = sustain << ( ENV_BITS - 5 );
	if ( change & 0x0f ) {
		UpdateRelease( chip );
	}
}